

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_pour(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  const_reference pvVar3;
  int *piVar4;
  long in_RDI;
  int amount;
  OBJ_AFFECT_DATA oaf;
  OBJ_DATA *puddle;
  OBJ_DATA *on;
  OBJ_DATA *out;
  char buf [4608];
  char arg [4608];
  OBJ_AFFECT_DATA *in_stack_ffffffffffffdb48;
  OBJ_DATA *in_stack_ffffffffffffdb50;
  CHAR_DATA *in_stack_ffffffffffffdb58;
  CHAR_DATA *ch_00;
  int sn;
  OBJ_DATA *in_stack_ffffffffffffdb60;
  int local_2484 [5];
  undefined2 local_246e;
  short local_246c;
  undefined2 local_2468;
  undefined2 local_2466;
  undefined2 local_2464;
  undefined4 local_2450;
  undefined8 local_2440;
  code *local_2438;
  OBJ_DATA *local_2430;
  OBJ_DATA *local_2428;
  OBJ_DATA *local_2420;
  char local_2418 [20];
  int in_stack_ffffffffffffdbfc;
  CHAR_DATA *in_stack_ffffffffffffdc00;
  CHAR_DATA *in_stack_ffffffffffffed58;
  char *in_stack_ffffffffffffed60;
  CHAR_DATA *in_stack_ffffffffffffed68;
  char local_1218;
  
  pcVar2 = one_argument((char *)in_stack_ffffffffffffdb50,(char *)in_stack_ffffffffffffdb48);
  if (local_1218 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
  }
  else {
    local_2420 = get_obj_carry(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                               in_stack_ffffffffffffed58);
    if (local_2420 == (OBJ_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
    }
    else if (local_2420->item_type == 0x11) {
      if (local_2420->value[1] == 0) {
        send_to_char((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
      }
      else if (*pcVar2 == '\0') {
        local_2420->value[1] = 0;
        local_2420->value[3] = 0;
        pvVar3 = std::vector<liq_type,_std::allocator<liq_type>_>::operator[]
                           (&liq_table,(long)local_2420->value[2]);
        sprintf(local_2418,"You invert $p, spilling %s all over the ground.",pvVar3->liq_name);
        act((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50,
            in_stack_ffffffffffffdb48,0);
        pvVar3 = std::vector<liq_type,_std::allocator<liq_type>_>::operator[]
                           (&liq_table,(long)local_2420->value[2]);
        sprintf(local_2418,"$n inverts $p, spilling %s all over the ground.",pvVar3->liq_name);
        act((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50,
            in_stack_ffffffffffffdb48,0);
        if (local_2420->value[2] == 0) {
          bVar1 = is_ground(*(ROOM_INDEX_DATA **)(in_RDI + 0xa8));
          if (bVar1) {
            get_obj_index((int)((ulong)in_stack_ffffffffffffdb58 >> 0x20));
            local_2430 = create_object((OBJ_INDEX_DATA *)in_stack_ffffffffffffdc00,
                                       in_stack_ffffffffffffdbfc);
            obj_to_room(local_2430,*(ROOM_INDEX_DATA **)(in_RDI + 0xa8));
            init_affect_obj((OBJ_AFFECT_DATA *)0x57537b);
            local_246e = 0;
            local_2450 = 0;
            local_246c = gsn_puddle;
            local_2466 = 0;
            local_2464 = 0;
            local_2468 = 4;
            local_2438 = puddle_evaporate;
            local_2440 = 0;
            affect_to_obj(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
            sprintf(local_2418,"The water forms a puddle on the ground.");
            act((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58,
                in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,0);
          }
        }
        else {
          pcVar2 = local_2418;
          pvVar3 = std::vector<liq_type,_std::allocator<liq_type>_>::operator[]
                             (&liq_table,(long)local_2420->value[2]);
          sprintf(pcVar2,"%s evaporates rapidly and is gone.",pvVar3->liq_name);
          act(pcVar2,in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,0
             );
        }
      }
      else {
        local_2428 = get_obj_here(in_stack_ffffffffffffdb58,(char *)in_stack_ffffffffffffdb50);
        if (local_2428 == (OBJ_DATA *)0x0) {
          send_to_char((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
        }
        else if (local_2420 == local_2428) {
          send_to_char((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
        }
        else {
          pvVar3 = std::vector<liq_type,_std::allocator<liq_type>_>::operator[]
                             (&liq_table,(long)local_2420->value[2]);
          local_2484[0] = pvVar3->liq_affect[4] * 3;
          piVar4 = std::min<int>(local_2484,local_2420->value + 1);
          local_2484[0] = *piVar4;
          local_2420->value[1] = local_2420->value[1] - local_2484[0];
          pcVar2 = local_2418;
          pvVar3 = std::vector<liq_type,_std::allocator<liq_type>_>::operator[]
                             (&liq_table,(long)local_2420->value[2]);
          sprintf(pcVar2,"You pour %s from $p onto $P.",pvVar3->liq_name);
          act((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58,pcVar2,
              in_stack_ffffffffffffdb48,0);
          ch_00 = (CHAR_DATA *)local_2418;
          pvVar3 = std::vector<liq_type,_std::allocator<liq_type>_>::operator[]
                             (&liq_table,(long)local_2420->value[2]);
          sprintf((char *)ch_00,"$n pours %s from $p onto $P.",pvVar3->liq_name);
          act((char *)in_stack_ffffffffffffdb60,ch_00,pcVar2,in_stack_ffffffffffffdb48,0);
          bVar1 = is_affected_by((OBJ_DATA *)ch_00,(int)((ulong)pcVar2 >> 0x20));
          if (bVar1) {
            act((char *)in_stack_ffffffffffffdb60,ch_00,pcVar2,in_stack_ffffffffffffdb48,0);
            sn = (int)((ulong)ch_00 >> 0x20);
            bVar1 = is_affected_obj(local_2428,(int)gsn_immolate);
            if (bVar1) {
              affect_strip_obj(in_stack_ffffffffffffdb60,sn);
            }
          }
        }
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
    }
  }
  return;
}

Assistant:

void do_pour(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_STRING_LENGTH], buf[MAX_STRING_LENGTH];
	OBJ_DATA *out, *on, *puddle;
	OBJ_AFFECT_DATA oaf;
	int amount;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Pour what on what?\n\r", ch);
		return;
	}

	out = get_obj_carry(ch, arg, ch);

	if (out == nullptr)
	{
		send_to_char("You don't have that item.\n\r", ch);
		return;
	}

	if (out->item_type != ITEM_DRINK_CON)
	{
		send_to_char("That's not a drink container.\n\r", ch);
		return;
	}

	if (out->value[1] == 0)
	{
		send_to_char("It's already empty.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		out->value[1] = 0;
		out->value[3] = 0;

		sprintf(buf, "You invert $p, spilling %s all over the ground.", liq_table[out->value[2]].liq_name);
		act(buf, ch, out, nullptr, TO_CHAR);

		sprintf(buf, "$n inverts $p, spilling %s all over the ground.", liq_table[out->value[2]].liq_name);
		act(buf, ch, out, nullptr, TO_ROOM);

		if (out->value[2] != LIQ_WATER)
		{
			sprintf(buf, "%s evaporates rapidly and is gone.", liq_table[out->value[2]].liq_name);
			act(buf, ch, 0, 0, TO_ALL);
		}
		else if (is_ground(ch->in_room))
		{
			puddle = create_object(get_obj_index(OBJ_VNUM_PUDDLE), ch->level);
			obj_to_room(puddle, ch->in_room);

			init_affect_obj(&oaf);
			oaf.where = TO_OBJ_AFFECTS;
			oaf.aftype = AFT_SPELL;
			oaf.type = gsn_puddle;
			oaf.location = 0;
			oaf.modifier = 0;
			oaf.duration = 4;
			oaf.owner = ch;
			oaf.end_fun = puddle_evaporate;
			oaf.tick_fun = 0;
			affect_to_obj(puddle, &oaf);

			sprintf(buf, "The water forms a puddle on the ground.");
			act(buf, ch, 0, 0, TO_ALL);
		}

		return;
	}

	on = get_obj_here(ch, argument);

	if (on == nullptr)
	{
		send_to_char("You don't see that here.\n\r", ch);
		return;
	}

	if (out == on)
	{
		send_to_char("You cannot pour that on itself.\n\r", ch);
		return;
	}

	amount = liq_table[out->value[2]].liq_affect[4] * 3;
	amount = std::min(amount, out->value[1]);
	out->value[1] -= amount;

	sprintf(buf, "You pour %s from $p onto $P.", liq_table[out->value[2]].liq_name);
	act(buf, ch, out, on, TO_CHAR);

	sprintf(buf, "$n pours %s from $p onto $P.", liq_table[out->value[2]].liq_name);
	act(buf, ch, out, on, TO_ROOM);

	if (is_affected_by(on, AFF_OBJ_BURNING))
	{
		act("$p fizzles and is extinguished.", ch, on, 0, TO_ALL);

		if (is_affected_obj(on, gsn_immolate))
			affect_strip_obj(on, gsn_immolate);
	}
}